

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.h
# Opt level: O2

Emissive * __thiscall pm::World::createMaterial<pm::Emissive>(World *this)

{
  pointer *__ptr;
  _Head_base<0UL,_pm::Material_*,_false> local_28;
  Material *local_20;
  
  std::make_unique<pm::Emissive>();
  local_28._M_head_impl = local_20;
  local_20 = (Material *)0x0;
  std::
  vector<std::unique_ptr<pm::Material,std::default_delete<pm::Material>>,std::allocator<std::unique_ptr<pm::Material,std::default_delete<pm::Material>>>>
  ::emplace_back<std::unique_ptr<pm::Material,std::default_delete<pm::Material>>>
            ((vector<std::unique_ptr<pm::Material,std::default_delete<pm::Material>>,std::allocator<std::unique_ptr<pm::Material,std::default_delete<pm::Material>>>>
              *)&this->materials_,
             (unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *)&local_28);
  if (local_28._M_head_impl != (Material *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Material[1])();
  }
  local_28._M_head_impl = (Material *)0x0;
  if (local_20 != (Material *)0x0) {
    (**(code **)(*(long *)local_20 + 8))();
  }
  return (Emissive *)
         (this->materials_).
         super__Vector_base<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<pm::Material,_std::default_delete<pm::Material>_>._M_t.
         super__Tuple_impl<0UL,_pm::Material_*,_std::default_delete<pm::Material>_>.
         super__Head_base<0UL,_pm::Material_*,_false>._M_head_impl;
}

Assistant:

T *World::createMaterial(Args &&... args)
{
	materials_.push_back(std::make_unique<T>(std::forward<Args>(args)...));
	return static_cast<T *>(materials_.back().get());
}